

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

string * duckdb::Exception::ConstructMessageRecursive<char_const*>
                   (string *msg,
                   vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                   *values,char *param)

{
  char *in_RCX;
  vector *in_RSI;
  value_type *in_RDI;
  value_type *this;
  ExceptionFormatValue local_58;
  vector *local_10;
  
  this = in_RDI;
  local_10 = in_RSI;
  duckdb::ExceptionFormatValue::CreateFormatValue<char_const*>(&local_58,in_RCX);
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            this,in_RDI);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x71cd13);
  duckdb::Exception::ConstructMessageRecursive((string *)in_RDI,local_10);
  return (string *)this;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}